

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScenePrivate::updatePalette(QGraphicsScenePrivate *this,QPalette *palette)

{
  QObject *pQVar1;
  long *plVar2;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *pQVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  QGraphicsItem *pQVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  QPalette::operator=(&this->palette,palette);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  plVar2 = *(long **)(*(long *)(pQVar1 + 8) + 0x88);
  (**(code **)(*plVar2 + 0x60))(&local_58,plVar2,1);
  if (local_48 != (undefined1 *)0x0) {
    lVar5 = CONCAT44(uStack_4c,uStack_50);
    lVar9 = (long)local_48 << 3;
    lVar8 = 0;
    do {
      this_00 = *(QGraphicsItem **)(lVar5 + lVar8);
      pQVar7 = QGraphicsItem::parentItem(this_00);
      if (pQVar7 == (QGraphicsItem *)0x0) {
        pQVar3 = (this_00->d_ptr).d;
        uVar6 = QPalette::resolveMask();
        (*pQVar3->_vptr_QGraphicsItemPrivate[6])(pQVar3,(ulong)uVar6);
      }
      lVar8 = lVar8 + 8;
    } while (lVar9 != lVar8);
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_68,PaletteChange);
  QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_68);
  QEvent::~QEvent((QEvent *)&local_68);
  piVar4 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updatePalette(const QPalette &palette)
{
    Q_Q(QGraphicsScene);

    // Update local palette setting.
    this->palette = palette;

    // Resolve the palettes of all top-level widget items, or widget items
    // whose parent is not a widget.
    const auto items = q->items();
    for (QGraphicsItem *item : items) {
        if (!item->parentItem()) {
            // ResolvePalette for an item is a noop operation, but
            // every item can be a widget, or can have a widget
            // children.
            item->d_ptr->resolvePalette(palette.resolveMask());
        }
    }

    // Send the scene a PaletteChange event.
    QEvent event(QEvent::PaletteChange);
    QCoreApplication::sendEvent(q, &event);
}